

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Point *p)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Point: ",7);
  poVar1 = std::ostream::_M_insert<double>(p->v[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>(p->v[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>(p->v[2]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream & operator<<( std::ostream & os, const Point & p)
{
	os << "Point: " << p(0) << " " << p(1) << " " << p(2) << std::endl;
	return os;
}